

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

Var create_type_object(Context *ctx,Type type)

{
  Var obj;
  char *src;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  switch(type) {
  case Any:
    src = "any";
    break;
  case Anyfunc:
    src = "anyfunc";
    break;
  case V128:
    src = "v128";
    break;
  case F64:
    src = "f64";
    break;
  case F32:
    src = "f32";
    break;
  case I64:
    src = "i64";
    break;
  case I32:
    src = "i32";
    break;
  default:
    if (type == Void) {
      src = "void";
      break;
    }
    if (type == Func) {
      src = "func";
      break;
    }
    if (type == ExceptRef) {
      src = "except_ref";
      break;
    }
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case 0xfffffff4:
  case 0xfffffff5:
  case 0xfffffff6:
  case 0xfffffff7:
  case 0xfffffff8:
  case 0xfffffff9:
  case 0xfffffffa:
    src = "<type index>";
  }
  write_string(ctx,obj,0xb,src,0xffffffff);
  return obj;
}

Assistant:

Js::Var create_type_object(Context* ctx, Type type)
{
    Js::Var typeObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    write_string(ctx, typeObj, PropertyIds::type, GetTypeName(type));
    return typeObj;
}